

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<ImageHandler> imgHandler;
  shared_ptr<VideoHandler> videoHandler;
  opt_t opt;
  _opt *in_stack_ffffffffffffff00;
  opt_t *in_stack_ffffffffffffff10;
  char **in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined1 local_d0 [32];
  undefined1 local_b0 [96];
  undefined1 local_50 [32];
  undefined1 local_30 [44];
  int local_4;
  
  local_4 = 0;
  _opt::_opt(in_stack_ffffffffffffff00);
  processCommandLine(in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    local_4 = -1;
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::make_shared<VideoHandler,std::__cxx11::string&,std::__cxx11::string&>
                (in_stack_ffffffffffffff28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      peVar2 = std::__shared_ptr_access<VideoHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VideoHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x158654);
      (**(peVar2->super_MediaHandler)._vptr_MediaHandler)(peVar2,local_d0,local_30);
      peVar2 = std::__shared_ptr_access<VideoHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VideoHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x158678);
      (*(peVar2->super_MediaHandler)._vptr_MediaHandler[1])();
      peVar2 = std::__shared_ptr_access<VideoHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VideoHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x158690);
      (*(peVar2->super_MediaHandler)._vptr_MediaHandler[2])(peVar2,local_b0);
      std::shared_ptr<VideoHandler>::~shared_ptr((shared_ptr<VideoHandler> *)0x1586ad);
    }
    else {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::make_shared<ImageHandler,std::__cxx11::string&,std::__cxx11::string&>
                  (in_stack_ffffffffffffff28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        peVar3 = std::__shared_ptr_access<ImageHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ImageHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15870b);
        (**(peVar3->super_MediaHandler)._vptr_MediaHandler)(peVar3,local_d0,local_30);
        peVar3 = std::__shared_ptr_access<ImageHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ImageHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15872f);
        (*(peVar3->super_MediaHandler)._vptr_MediaHandler[1])();
        peVar3 = std::__shared_ptr_access<ImageHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ImageHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x158747);
        (*(peVar3->super_MediaHandler)._vptr_MediaHandler[2])(peVar3,local_50);
        std::shared_ptr<ImageHandler>::~shared_ptr((shared_ptr<ImageHandler> *)0x158767);
      }
    }
    local_4 = 0;
  }
  _opt::~_opt(in_stack_ffffffffffffff00);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    opt_t opt;

    processCommandLine(argc, argv, opt);

    if (!opt.video.empty() && !opt.image.empty()) 
    {
        return -1;
    }
    
    if (!opt.video.empty()) 
    {
        auto videoHandler = std::make_shared<VideoHandler>(opt.detector, opt.effect);
        videoHandler->preProcess(opt.filePath, opt.target);
        videoHandler->doTask();
        videoHandler->postProcess(opt.video);
    } 
    else if (!opt.image.empty()) 
    {
        auto imgHandler = std::make_shared<ImageHandler>(opt.detector, opt.effect);
        imgHandler->preProcess(opt.filePath, opt.target);
        imgHandler->doTask();
        imgHandler->postProcess(opt.image);
    }

    return 0;
}